

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

Node * __thiscall llvm::yaml::KeyValueNode::getValue(KeyValueNode *this)

{
  bool bVar1;
  BumpPtrAllocator *pBVar2;
  KeyValueNode *pKVar3;
  Token *pTVar4;
  KeyValueNode *local_190;
  KeyValueNode *local_178;
  KeyValueNode *local_160;
  KeyValueNode *local_148;
  KeyValueNode *local_130;
  Token *t;
  undefined1 local_c1;
  BumpPtrAllocator *local_c0;
  KeyValueNode *local_b8;
  Twine local_b0;
  undefined1 local_91;
  BumpPtrAllocator *local_90;
  KeyValueNode *local_88;
  Token *local_80;
  Token *t_1;
  BumpPtrAllocator *local_70;
  KeyValueNode *local_68;
  undefined1 local_49;
  BumpPtrAllocator *local_48;
  KeyValueNode *local_40;
  Twine local_38;
  Node *local_20;
  Node *Key;
  KeyValueNode *this_local;
  
  if (this->Value == (Node *)0x0) {
    Key = &this->super_Node;
    local_20 = getKey(this);
    if (local_20 == (Node *)0x0) {
      Twine::Twine(&local_38,"Null key in Key Value.");
      pTVar4 = Node::peekNext(&this->super_Node);
      Node::setError(&this->super_Node,&local_38,pTVar4);
      pBVar2 = Node::getAllocator(&this->super_Node);
      pKVar3 = (KeyValueNode *)Node::operator_new(0x48,pBVar2,0x10);
      local_130 = (KeyValueNode *)0x0;
      if (pKVar3 != (KeyValueNode *)0x0) {
        local_49 = 1;
        local_48 = pBVar2;
        local_40 = pKVar3;
        NullNode::NullNode((NullNode *)pKVar3,(this->super_Node).Doc);
        local_130 = pKVar3;
      }
      this->Value = &local_130->super_Node;
      this_local = local_130;
    }
    else {
      (*local_20->_vptr_Node[1])();
      bVar1 = Node::failed(&this->super_Node);
      if (bVar1) {
        pBVar2 = Node::getAllocator(&this->super_Node);
        pKVar3 = (KeyValueNode *)Node::operator_new(0x48,pBVar2,0x10);
        local_148 = (KeyValueNode *)0x0;
        if (pKVar3 != (KeyValueNode *)0x0) {
          t_1._7_1_ = 1;
          local_70 = pBVar2;
          local_68 = pKVar3;
          NullNode::NullNode((NullNode *)pKVar3,(this->super_Node).Doc);
          local_148 = pKVar3;
        }
        this->Value = &local_148->super_Node;
        this_local = local_148;
      }
      else {
        local_80 = Node::peekNext(&this->super_Node);
        if ((((local_80->Kind == TK_BlockEnd) || (local_80->Kind == TK_FlowMappingEnd)) ||
            (local_80->Kind == TK_Key)) ||
           ((local_80->Kind == TK_FlowEntry || (local_80->Kind == TK_Error)))) {
          pBVar2 = Node::getAllocator(&this->super_Node);
          pKVar3 = (KeyValueNode *)Node::operator_new(0x48,pBVar2,0x10);
          local_160 = (KeyValueNode *)0x0;
          if (pKVar3 != (KeyValueNode *)0x0) {
            local_91 = 1;
            local_90 = pBVar2;
            local_88 = pKVar3;
            NullNode::NullNode((NullNode *)pKVar3,(this->super_Node).Doc);
            local_160 = pKVar3;
          }
          this->Value = &local_160->super_Node;
          this_local = local_160;
        }
        else if (local_80->Kind == TK_Value) {
          Node::getNext((Token *)&t,&this->super_Node);
          Token::~Token((Token *)&t);
          pTVar4 = Node::peekNext(&this->super_Node);
          if ((pTVar4->Kind == TK_BlockEnd) || (pTVar4->Kind == TK_Key)) {
            pBVar2 = Node::getAllocator(&this->super_Node);
            pKVar3 = (KeyValueNode *)Node::operator_new(0x48,pBVar2,0x10);
            local_190 = (KeyValueNode *)0x0;
            if (pKVar3 != (KeyValueNode *)0x0) {
              NullNode::NullNode((NullNode *)pKVar3,(this->super_Node).Doc);
              local_190 = pKVar3;
            }
            this->Value = &local_190->super_Node;
            this_local = local_190;
          }
          else {
            this_local = (KeyValueNode *)Node::parseBlockNode(&this->super_Node);
            this->Value = (Node *)this_local;
          }
        }
        else {
          Twine::Twine(&local_b0,"Unexpected token in Key Value.");
          Node::setError(&this->super_Node,&local_b0,local_80);
          pBVar2 = Node::getAllocator(&this->super_Node);
          pKVar3 = (KeyValueNode *)Node::operator_new(0x48,pBVar2,0x10);
          local_178 = (KeyValueNode *)0x0;
          if (pKVar3 != (KeyValueNode *)0x0) {
            local_c1 = 1;
            local_c0 = pBVar2;
            local_b8 = pKVar3;
            NullNode::NullNode((NullNode *)pKVar3,(this->super_Node).Doc);
            local_178 = pKVar3;
          }
          this->Value = &local_178->super_Node;
          this_local = local_178;
        }
      }
    }
  }
  else {
    this_local = (KeyValueNode *)this->Value;
  }
  return &this_local->super_Node;
}

Assistant:

Node *KeyValueNode::getValue() {
  if (Value)
    return Value;

  if (Node* Key = getKey())
    Key->skip();
  else {
    setError("Null key in Key Value.", peekNext());
    return Value = new (getAllocator()) NullNode(Doc);
  }

  if (failed())
    return Value = new (getAllocator()) NullNode(Doc);

  // Handle implicit null values.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_FlowMappingEnd
        || t.Kind == Token::TK_Key
        || t.Kind == Token::TK_FlowEntry
        || t.Kind == Token::TK_Error) {
      return Value = new (getAllocator()) NullNode(Doc);
    }

    if (t.Kind != Token::TK_Value) {
      setError("Unexpected token in Key Value.", t);
      return Value = new (getAllocator()) NullNode(Doc);
    }
    getNext(); // skip TK_Value.
  }

  // Handle explicit null values.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Key) {
    return Value = new (getAllocator()) NullNode(Doc);
  }

  // We got a normal value.
  return Value = parseBlockNode();
}